

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZGeoElSidePartition>::TPZVec
          (TPZVec<TPZGeoElSidePartition> *this,TPZVec<TPZGeoElSidePartition> *copy)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  TPZGeoElSidePartition *pTVar5;
  long in_RSI;
  undefined8 *in_RDI;
  ulong uVar6;
  int64_t i;
  TPZGeoElSidePartition *in_stack_ffffffffffffff88;
  TPZGeoElSidePartition *in_stack_ffffffffffffff90;
  TPZGeoElSidePartition *this_00;
  TPZGeoElSidePartition *local_58;
  long local_28;
  
  *in_RDI = &PTR__TPZVec_024bb508;
  in_RDI[1] = 0;
  if (*(long *)(in_RSI + 0x10) < 1) {
    in_RDI[1] = 0;
  }
  else {
    uVar1 = *(ulong *)(in_RSI + 0x10);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar3 = SUB168(auVar2 * ZEXT816(0x38),0);
    uVar6 = uVar3 + 8;
    if (SUB168(auVar2 * ZEXT816(0x38),8) != 0 || 0xfffffffffffffff7 < uVar3) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar4 = (ulong *)operator_new__(uVar6);
    *puVar4 = uVar1;
    pTVar5 = (TPZGeoElSidePartition *)(puVar4 + 1);
    if (uVar1 != 0) {
      this_00 = pTVar5 + uVar1;
      local_58 = pTVar5;
      do {
        TPZGeoElSidePartition::TPZGeoElSidePartition(this_00);
        local_58 = local_58 + 1;
      } while (local_58 != this_00);
    }
    in_RDI[1] = pTVar5;
  }
  for (local_28 = 0; local_28 < *(long *)(in_RSI + 0x10); local_28 = local_28 + 1) {
    TPZGeoElSidePartition::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  in_RDI[2] = *(undefined8 *)(in_RSI + 0x10);
  in_RDI[3] = *(undefined8 *)(in_RSI + 0x18);
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}